

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

void __thiscall
QComboBoxPrivateScroller::paintEvent(QComboBoxPrivateScroller *this,QPaintEvent *param_2)

{
  QStyle *pQVar1;
  QStyleOption *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  QPainter p;
  QStyleOptionMenuItem menuOpt;
  QWidget *in_stack_ffffffffffffff08;
  QRect *in_stack_ffffffffffffff10;
  QStyleOptionMenuItem *this_00;
  QPainter *this_01;
  QRect local_b8;
  undefined1 *local_a8;
  QStyleOptionMenuItem local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_a8,&in_RDI->super_QPaintDevice);
  memset(&local_a0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x544c38);
  QStyleOption::initFrom(in_RSI,in_RDI);
  local_a0.checkType = NotCheckable;
  QVar2 = QWidget::rect((QWidget *)in_RSI);
  local_b8._0_8_ = QVar2._0_8_;
  local_a0.menuRect.x1.m_i = local_b8.x1.m_i;
  local_a0.menuRect.y1.m_i = local_b8.y1.m_i;
  local_b8._8_8_ = QVar2._8_8_;
  local_a0.menuRect.x2.m_i = local_b8.x2.m_i;
  local_a0.menuRect.y2.m_i = local_b8.y2.m_i;
  local_a0.maxIconWidth = 0;
  local_a0.reservedShortcutWidth = 0;
  local_a0.menuItemType = Scroller;
  if (*(int *)(in_RDI + 1) == 1) {
    QFlags<QStyle::StateFlag>::operator|=(&local_a0.super_QStyleOption.state,State_DownArrow);
  }
  QWidget::rect((QWidget *)in_RSI);
  this_01 = (QPainter *)&local_a8;
  QPainter::eraseRect(this_01,in_stack_ffffffffffffff10);
  pQVar1 = QWidget::style(in_stack_ffffffffffffff08);
  this_00 = &local_a0;
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,0xf,this_00,this_01,0);
  QStyleOptionMenuItem::~QStyleOptionMenuItem(this_00);
  QPainter::~QPainter(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *) override {
        QPainter p(this);
        QStyleOptionMenuItem menuOpt;
        menuOpt.initFrom(this);
        menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
        menuOpt.menuRect = rect();
        menuOpt.maxIconWidth = 0;
        menuOpt.reservedShortcutWidth = 0;
        menuOpt.menuItemType = QStyleOptionMenuItem::Scroller;
        if (sliderAction == QAbstractSlider::SliderSingleStepAdd)
            menuOpt.state |= QStyle::State_DownArrow;
        p.eraseRect(rect());
        style()->drawControl(QStyle::CE_MenuScroller, &menuOpt, &p);
    }